

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::optional<pbrt::SampledGrid<pbrt::RGB>_>::optional
          (optional<pbrt::SampledGrid<pbrt::RGB>_> *this,optional<pbrt::SampledGrid<pbrt::RGB>_> *v)

{
  bool bVar1;
  undefined8 uVar2;
  
  bVar1 = v->set;
  this->set = bVar1;
  if (bVar1 == true) {
    (this->optionalValue).__align = (v->optionalValue).__align;
    *(undefined8 *)((long)&this->optionalValue + 8) = 0;
    *(undefined8 *)((long)&this->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&this->optionalValue + 0x18) = 0;
    uVar2 = *(undefined8 *)((long)&v->optionalValue + 0x18);
    *(undefined8 *)((long)&this->optionalValue + 0x10) =
         *(undefined8 *)((long)&v->optionalValue + 0x10);
    *(undefined8 *)((long)&this->optionalValue + 0x18) = uVar2;
    *(undefined8 *)((long)&this->optionalValue + 8) = *(undefined8 *)((long)&v->optionalValue + 8);
    *(undefined8 *)((long)&v->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&v->optionalValue + 8) = 0;
    *(undefined8 *)((long)&v->optionalValue + 0x10) = 0;
    *(undefined4 *)((long)&this->optionalValue + 0x28) =
         *(undefined4 *)((long)&v->optionalValue + 0x28);
    *(undefined8 *)((long)&this->optionalValue + 0x20) =
         *(undefined8 *)((long)&v->optionalValue + 0x20);
    if (v->set == true) {
      vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_>::~vector
                ((vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *)v);
      v->set = false;
    }
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }